

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty.cpp
# Opt level: O0

string * __thiscall
cli::getPrettySize_abi_cxx11_(string *__return_storage_ptr__,cli *this,uint32_t size)

{
  string local_40;
  double local_20;
  double newSize;
  int suffIndex;
  uint32_t size_local;
  
  newSize._4_4_ = SUB84(this,0);
  newSize._0_4_ = 0;
  for (local_20 = (double)((ulong)this & 0xffffffff); 1024.0 <= local_20 && newSize._0_4_ < 4;
      local_20 = local_20 / 1024.0) {
    newSize._0_4_ = newSize._0_4_ + 1;
  }
  _suffIndex = __return_storage_ptr__;
  anon_unknown_3::toString<double>(&local_40,&local_20,2);
  std::operator+(__return_storage_ptr__,&local_40,getPrettySize::suffixes[newSize._0_4_]);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string getPrettySize(std::uint32_t size)
	{
		static const char *suffixes[] = { " B", " KiB", " MiB", " GiB", " TiB" };
		static const int suffixesSize = 5;

		int suffIndex = 0;
		double newSize = size;

		while ((newSize >= 1024.0) && (suffIndex < suffixesSize - 1))
		{
			++suffIndex;
			newSize /= 1024.0;
		}

		return toString(newSize, 2) + suffixes[suffIndex];
	}